

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O3

int main(void)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  int iio_int;
  float iio_float;
  undefined8 local_28;
  
  local_28 = in_RAX;
  mraa_init();
  lVar2 = mraa_iio_init(0);
  if (lVar2 == 0) {
    main_cold_6();
  }
  else {
    iVar1 = mraa_iio_write_float(0x3c9cfbb9,lVar2,"in_accel_scale");
    if (iVar1 == 0) {
      iVar1 = mraa_iio_read_float(lVar2,"in_accel_scale",(long)&local_28 + 4);
      if (iVar1 == 0) {
        fprintf(_stdout,"IIO scale: %f\n",(double)local_28._4_4_);
        iVar1 = mraa_iio_write_int(lVar2,"scan_elements/in_accel_x_en",1);
        if (iVar1 == 0) {
          iVar1 = mraa_iio_read_int(lVar2,"scan_elements/in_accel_x_en",&local_28);
          if (iVar1 == 0) {
            fprintf(_stdout,"IIO enable status: %d\n",local_28 & 0xffffffff);
            iVar1 = mraa_iio_trigger_buffer(lVar2,interrupt,lVar2);
            if (iVar1 == 0) {
              fwrite("Waiting for the trigger...\n",0x1b,1,_stdout);
              sleep(100);
              mraa_iio_close(lVar2);
              mraa_deinit();
              return 0;
            }
            main_cold_5();
          }
          else {
            main_cold_4();
          }
        }
        else {
          main_cold_3();
        }
      }
      else {
        main_cold_2();
      }
    }
    else {
      main_cold_1();
    }
    mraa_result_print(iVar1);
    mraa_iio_close(lVar2);
    mraa_deinit();
  }
  return 1;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_iio_context iio;
    float iio_float;
    int iio_int;

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize iio */
    iio = mraa_iio_init(IIO_DEV);
    if (iio == NULL) {
        fprintf(stderr, "Failed to initialize IIO device\n");
        mraa_deinit();
        return EXIT_FAILURE;
    }

    status = mraa_iio_write_float(iio, "in_accel_scale", 0.019163);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to write scale to IIO device\n");
        goto err_exit;
    }

    status = mraa_iio_read_float(iio, "in_accel_scale", &iio_float);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to read scale from IIO device\n");
        goto err_exit;
    }

    fprintf(stdout, "IIO scale: %f\n", iio_float);

    status = mraa_iio_write_int(iio, "scan_elements/in_accel_x_en", 1);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to enable axis of the IIO device\n");
        goto err_exit;
    }

    status = mraa_iio_read_int(iio, "scan_elements/in_accel_x_en", &iio_int);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to read enable status from IIO device\n");
        goto err_exit;
    }

    fprintf(stdout, "IIO enable status: %d\n", iio_int);

    status = mraa_iio_trigger_buffer(iio, interrupt, (void*) iio);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Failed to set IIO buffer trigger\n");
        goto err_exit;
    }

    /* wait for the trigger */
    fprintf(stdout, "Waiting for the trigger...\n");
    sleep(100);

    /* close IIO device */
    mraa_iio_close(iio);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* close IIO device */
    mraa_iio_close(iio);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}